

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

int Abc_SclCountBufferFanoutsInt(Abc_Obj_t *pObj)

{
  int *piVar1;
  void **ppvVar2;
  Abc_Obj_t *pObj_00;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = (long)(pObj->vFanouts).nSize;
  uVar4 = 0;
  iVar5 = 0;
  if (0 < lVar7) {
    piVar1 = (pObj->vFanouts).pArray;
    ppvVar2 = pObj->pNtk->vObjs->pArray;
    lVar6 = 0;
    iVar5 = 0;
    do {
      pObj_00 = (Abc_Obj_t *)ppvVar2[piVar1[lVar6]];
      if (((*(uint *)&pObj_00->field_0x14 & 0xf) == 7) && ((pObj_00->vFanins).nSize == 1)) {
        iVar3 = Abc_SclCountBufferFanoutsInt(pObj_00);
        iVar5 = iVar5 + iVar3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
    uVar4 = (uint)((pObj->vFanins).nSize == 1);
  }
  return uVar4 + iVar5;
}

Assistant:

int Abc_SclCountBufferFanoutsInt( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, Counter = 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( Abc_ObjIsBuffer(pFanout) )
            Counter += Abc_SclCountBufferFanoutsInt( pFanout );
    return Counter + Abc_ObjIsBuffer(pObj);
}